

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int EmitAlphaRGBA4444(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  byte bVar1;
  uint uVar2;
  WEBP_CSP_MODE WVar3;
  WebPDecBuffer *pWVar4;
  int iVar5;
  byte bVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  ulong uVar9;
  bool bVar10;
  int num_rows;
  uint8_t *local_40;
  int local_34;
  
  local_40 = io->a;
  if (local_40 != (uint8_t *)0x0) {
    uVar2 = io->mb_w;
    pWVar4 = p->output;
    WVar3 = pWVar4->colorspace;
    iVar5 = GetAlphaSourceRow(io,&local_40,&local_34);
    puVar8 = (pWVar4->u).RGBA.rgba + (long)(pWVar4->u).RGBA.stride * (long)iVar5;
    if (local_34 < 1) {
      bVar10 = true;
    }
    else {
      puVar7 = puVar8 + 1;
      bVar6 = 0xf;
      iVar5 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar9 = 0;
          do {
            bVar1 = local_40[uVar9];
            puVar7[uVar9 * 2] = puVar7[uVar9 * 2] & 0xf0 | bVar1 >> 4;
            bVar6 = bVar6 & bVar1 >> 4;
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
        local_40 = local_40 + io->width;
        puVar7 = puVar7 + (pWVar4->u).RGBA.stride;
        iVar5 = iVar5 + 1;
      } while (iVar5 != local_34);
      bVar10 = bVar6 == 0xf;
    }
    if ((!bVar10) && (0xfffffffb < WVar3 - MODE_YUV)) {
      (*WebPApplyAlphaMultiply4444)(puVar8,uVar2,local_34,(pWVar4->u).RGBA.stride);
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaRGBA4444(const VP8Io* const io, WebPDecParams* const p,
                             int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  if (alpha != NULL) {
    const int mb_w = io->mb_w;
    const WEBP_CSP_MODE colorspace = p->output->colorspace;
    const WebPRGBABuffer* const buf = &p->output->u.RGBA;
    int num_rows;
    const size_t start_y = GetAlphaSourceRow(io, &alpha, &num_rows);
    uint8_t* const base_rgba = buf->rgba + start_y * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
    uint8_t* alpha_dst = base_rgba;
#else
    uint8_t* alpha_dst = base_rgba + 1;
#endif
    uint32_t alpha_mask = 0x0f;
    int i, j;
    for (j = 0; j < num_rows; ++j) {
      for (i = 0; i < mb_w; ++i) {
        // Fill in the alpha value (converted to 4 bits).
        const uint32_t alpha_value = alpha[i] >> 4;
        alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
        alpha_mask &= alpha_value;
      }
      alpha += io->width;
      alpha_dst += buf->stride;
    }
    (void)expected_num_lines_out;
    assert(expected_num_lines_out == num_rows);
    if (alpha_mask != 0x0f && WebPIsPremultipliedMode(colorspace)) {
      WebPApplyAlphaMultiply4444(base_rgba, mb_w, num_rows, buf->stride);
    }
  }
  return 0;
}